

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidiout.cpp
# Opt level: O1

int anon_unknown.dwarf_1b23b::RtMidiOut_getcurrentapi(lua_State *L)

{
  int iVar1;
  RtMidiOut *pRVar2;
  
  lua_getfield(L,0xfff0b9d8,"luartmidi.rtmidiout");
  pRVar2 = luaGetUserdata<RtMidiOut>(L,1,"RtMidiOut");
  iVar1 = (*((pRVar2->super_RtMidi).rtapi_)->_vptr_MidiApi[2])();
  lua_pushinteger(L,iVar1);
  return 1;
}

Assistant:

int RtMidiOut_getcurrentapi(lua_State *L) {
	auto &self = getRtMidiOut(L, 1);
	lua_pushinteger(L, self.getCurrentApi());
	return 1;
}